

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O1

int onig_regset_replace(OnigRegSet *set,int at,regex_t *reg)

{
  int iVar1;
  OnigRegion **ppOVar2;
  uint uVar3;
  long lVar5;
  long lVar6;
  ulong uVar4;
  
  iVar1 = -0x1e;
  if (-1 < at) {
    uVar4 = (ulong)(uint)at;
    if (at < set->n) {
      if (reg == (regex_t *)0x0) {
        onig_region_free(set->rs[uVar4].region,1);
        iVar1 = set->n + -1;
        if (at < iVar1) {
          ppOVar2 = &set->rs[uVar4 + 1].region;
          do {
            ppOVar2[-3] = (OnigRegion *)((RR *)(ppOVar2 + -1))->reg;
            ppOVar2[-2] = *ppOVar2;
            ppOVar2 = ppOVar2 + 2;
            uVar3 = (int)uVar4 + 1;
            uVar4 = (ulong)uVar3;
          } while ((int)uVar3 < iVar1);
        }
        set->n = iVar1;
      }
      else {
        if ((reg->options & 0x10) != 0) {
          return -0x1e;
        }
        if ((1 < set->n) && (reg->enc != set->enc)) {
          return -0x1e;
        }
        set->rs[uVar4].reg = reg;
      }
      if (set->n < 1) {
        iVar1 = 0;
      }
      else {
        iVar1 = 0;
        lVar6 = 0;
        lVar5 = 0;
        do {
          update_regset_by_reg(set,*(regex_t **)((long)&set->rs->reg + lVar6));
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 0x10;
        } while (lVar5 < set->n);
      }
    }
  }
  return iVar1;
}

Assistant:

extern int
onig_regset_replace(OnigRegSet* set, int at, regex_t* reg)
{
  int i;

  if (at < 0 || at >= set->n)
    return ONIGERR_INVALID_ARGUMENT;

  if (IS_NULL(reg)) {
    onig_region_free(set->rs[at].region, 1);
    for (i = at; i < set->n - 1; i++) {
      set->rs[i].reg    = set->rs[i+1].reg;
      set->rs[i].region = set->rs[i+1].region;
    }
    set->n--;
  }
  else {
#ifdef USE_FIND_LONGEST_SEARCH_ALL_OF_RANGE
    if (OPTON_FIND_LONGEST(reg->options))
      return ONIGERR_INVALID_ARGUMENT;
#endif

    if (set->n > 1 && reg->enc != set->enc)
      return ONIGERR_INVALID_ARGUMENT;

    set->rs[at].reg = reg;
  }

  for (i = 0; i < set->n; i++)
    update_regset_by_reg(set, set->rs[i].reg);

  return 0;
}